

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwritefile.cpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
ReadBinaryFile_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,path *filename,size_t maxsize)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  long in_FS_OFFSET;
  char buffer [128];
  string retval;
  allocator<char> local_d9;
  allocator<char> local_d8 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fsbridge::fopen((char *)filename,"rb");
  if (__stream == (FILE *)0x0) {
    __return_storage_ptr__->first = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__return_storage_ptr__->second,"",local_d8);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    do {
      sVar2 = maxsize - local_58._M_string_length;
      if (0x7f < sVar2) {
        sVar2 = 0x80;
      }
      sVar2 = fread(local_d8,1,sVar2,__stream);
      iVar1 = ferror(__stream);
      if (iVar1 != 0) {
        fclose(__stream);
        __return_storage_ptr__->first = false;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__return_storage_ptr__->second,"",&local_d9);
        goto LAB_00dcfdbd;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (&local_58,local_58._M_string_length,0,(char *)local_d8,sVar2);
      iVar1 = feof(__stream);
    } while ((iVar1 == 0) && (local_58._M_string_length < maxsize));
    fclose(__stream);
    __return_storage_ptr__->first = true;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
LAB_00dcfdbd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<bool,std::string> ReadBinaryFile(const fs::path &filename, size_t maxsize)
{
    FILE *f = fsbridge::fopen(filename, "rb");
    if (f == nullptr)
        return std::make_pair(false,"");
    std::string retval;
    char buffer[128];
    do {
        const size_t n = fread(buffer, 1, std::min(sizeof(buffer), maxsize - retval.size()), f);
        // Check for reading errors so we don't return any data if we couldn't
        // read the entire file (or up to maxsize)
        if (ferror(f)) {
            fclose(f);
            return std::make_pair(false,"");
        }
        retval.append(buffer, buffer+n);
    } while (!feof(f) && retval.size() < maxsize);
    fclose(f);
    return std::make_pair(true,retval);
}